

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_parse(int argc,char **argv,void **argtable)

{
  arg_end *endtable_00;
  int iVar1;
  char **argv_00;
  int local_44;
  int i;
  char **argvcopy;
  int endindex;
  arg_end *endtable;
  arg_hdr **table;
  void **argtable_local;
  char **argv_local;
  int argc_local;
  
  arg_reset(argtable);
  iVar1 = arg_endindex((arg_hdr **)argtable);
  endtable_00 = (arg_end *)argtable[iVar1];
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable_00);
    argv_local._4_4_ = endtable_00->count;
  }
  else {
    argv_00 = (char **)argtable3_xmalloc((long)(argc + 1) << 3);
    for (local_44 = 0; local_44 < argc; local_44 = local_44 + 1) {
      argv_00[local_44] = argv[local_44];
    }
    argv_00[argc] = (char *)0x0;
    arg_parse_tagged(argc,argv_00,(arg_hdr **)argtable,endtable_00);
    arg_parse_untagged(argc,argv_00,(arg_hdr **)argtable,endtable_00);
    if (endtable_00->count == 0) {
      arg_parse_check((arg_hdr **)argtable,endtable_00);
    }
    argtable3_xfree(argv_00);
    argv_local._4_4_ = endtable_00->count;
  }
  return argv_local._4_4_;
}

Assistant:

int arg_parse(int argc, char** argv, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    struct arg_end* endtable;
    int endindex;
    char** argvcopy = NULL;
    int i;

    /*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

    /* reset any argtable data from previous invocations */
    arg_reset(argtable);

    /* locate the first end-of-table marker within the array */
    endindex = arg_endindex(table);
    endtable = (struct arg_end*)table[endindex];

    /* Special case of argc==0.  This can occur on Texas Instruments DSP. */
    /* Failure to trap this case results in an unwanted NULL result from  */
    /* the malloc for argvcopy (next code block).                         */
    if (argc == 0) {
        /* We must still perform post-parse checks despite the absence of command line arguments */
        arg_parse_check(table, endtable);

        /* Now we are finished */
        return endtable->count;
    }

    argvcopy = (char**)xmalloc(sizeof(char*) * (size_t)(argc + 1));

    /*
        Fill in the local copy of argv[]. We need a local copy
        because getopt rearranges argv[] which adversely affects
        susbsequent parsing attempts.
        */
    for (i = 0; i < argc; i++)
        argvcopy[i] = argv[i];

    argvcopy[argc] = NULL;

    /* parse the command line (local copy) for tagged options */
    arg_parse_tagged(argc, argvcopy, table, endtable);

    /* parse the command line (local copy) for untagged options */
    arg_parse_untagged(argc, argvcopy, table, endtable);

    /* if no errors so far then perform post-parse checks otherwise dont bother */
    if (endtable->count == 0)
        arg_parse_check(table, endtable);

    /* release the local copt of argv[] */
    xfree(argvcopy);

    return endtable->count;
}